

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineSearchBasedMethod.cpp
# Opt level: O0

void __thiscall
QuantLib::LineSearchBasedMethod::LineSearchBasedMethod
          (LineSearchBasedMethod *this,LineSearch *lineSearch)

{
  _func_int **alpha;
  _func_int **in_RSI;
  OptimizationMethod *in_RDI;
  RealType in_stack_ffffffffffffffc8;
  ArmijoLineSearch *in_stack_ffffffffffffffe0;
  
  OptimizationMethod::OptimizationMethod(in_RDI);
  in_RDI->_vptr_OptimizationMethod = (_func_int **)&PTR__LineSearchBasedMethod_005091a0;
  in_RDI[1]._vptr_OptimizationMethod = in_RSI;
  if (in_RDI[1]._vptr_OptimizationMethod == (_func_int **)0x0) {
    alpha = (_func_int **)operator_new(0x78);
    ArmijoLineSearch::ArmijoLineSearch
              (in_stack_ffffffffffffffe0,(RealType)in_RDI,(RealType)alpha,in_stack_ffffffffffffffc8)
    ;
    in_RDI[1]._vptr_OptimizationMethod = alpha;
  }
  return;
}

Assistant:

LineSearchBasedMethod::LineSearchBasedMethod(LineSearch* lineSearch) :
      lineSearch_(lineSearch) {
    if (!lineSearch_) lineSearch_ = new ArmijoLineSearch();
  }